

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O3

int socket_sort(void *s1,void *s2)

{
  int iVar1;
  
  iVar1 = *s1 - *s2;
  if (iVar1 == 0) {
    iVar1 = *(int *)((long)s1 + 4) - *(int *)((long)s2 + 4);
  }
  return iVar1;
}

Assistant:

static int socket_sort(const void* s1, const void* s2)
{
  client* socket1 = (client*)s1;
  client* socket2 = (client*)s2;
  if (socket1->client_ip != socket2->client_ip)
    return socket1->client_ip - socket2->client_ip;
  else
    return (int)(socket1->socket - socket2->socket);
}